

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_ri_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  uint16_t uVar1;
  int iVar2;
  SSL *ssl;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  if ((((byte)(*(ushort *)&hs->ssl->s3->field_0xdc >> 4) & 1 ^ 0xff) & 1) == 0) {
    __assert_fail("!ssl->s3->initial_handshake_complete",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x331,"bool bssl::ext_ri_add_serverhello(SSL_HANDSHAKE *, CBB *)");
  }
  uVar1 = ssl_protocol_version(hs->ssl);
  if (uVar1 < 0x304) {
    iVar2 = CBB_add_u16(out,0xff01);
    if (((iVar2 != 0) && (iVar2 = CBB_add_u16(out,1), iVar2 != 0)) &&
       (iVar2 = CBB_add_u8(out,'\0'), iVar2 != 0)) {
      return true;
    }
    hs_local._7_1_ = false;
  }
  else {
    hs_local._7_1_ = true;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_ri_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  SSL *const ssl = hs->ssl;
  // Renegotiation isn't supported as a server so this function should never be
  // called after the initial handshake.
  assert(!ssl->s3->initial_handshake_complete);

  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    return true;
  }

  if (!CBB_add_u16(out, TLSEXT_TYPE_renegotiate) ||
      !CBB_add_u16(out, 1 /* length */) ||
      !CBB_add_u8(out, 0 /* empty renegotiation info */)) {
    return false;
  }

  return true;
}